

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

ostream * Eigen::operator<<(ostream *s,
                           DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *m)

{
  ostream *poVar1;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [55];
  allocator local_131;
  string local_130 [32];
  IOFormat local_110;
  Matrix<double,_1,__1,_1,_1,__1> local_28;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *local_18;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *m_local;
  ostream *s_local;
  
  local_18 = m;
  m_local = (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)s;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::eval
            ((DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130," ",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"\n",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"",&local_209);
  IOFormat::IOFormat(&local_110,-1,0,(string *)local_130,(string *)local_168,(string *)local_190,
                     (string *)local_1b8,(string *)local_1e0,(string *)local_208);
  poVar1 = internal::print_matrix<Eigen::Matrix<double,1,_1,1,1,_1>>(s,&local_28,&local_110);
  IOFormat::~IOFormat(&local_110);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix(&local_28);
  return poVar1;
}

Assistant:

std::ostream & operator <<
(std::ostream & s,
 const DenseBase<Derived> & m)
{
  return internal::print_matrix(s, m.eval(), EIGEN_DEFAULT_IO_FORMAT);
}